

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConvertToLHProcess.cpp
# Opt level: O0

void __thiscall
Assimp::MakeLeftHandedProcess::ProcessMesh(MakeLeftHandedProcess *this,aiMesh *pMesh)

{
  aiVector3D *paVar1;
  aiBone *paVar2;
  bool bVar3;
  Logger *this_00;
  uint local_44;
  uint a_3;
  aiBone *bone;
  size_t a_2;
  size_t a_1;
  size_t m;
  size_t a;
  aiMesh *pMesh_local;
  MakeLeftHandedProcess *this_local;
  
  if (pMesh == (aiMesh *)0x0) {
    this_00 = DefaultLogger::get();
    Logger::error(this_00,"Nullptr to mesh found.");
  }
  else {
    for (m = 0; m < pMesh->mNumVertices; m = m + 1) {
      pMesh->mVertices[m].z = pMesh->mVertices[m].z * -1.0;
      bVar3 = aiMesh::HasNormals(pMesh);
      if (bVar3) {
        pMesh->mNormals[m].z = pMesh->mNormals[m].z * -1.0;
      }
      bVar3 = aiMesh::HasTangentsAndBitangents(pMesh);
      if (bVar3) {
        pMesh->mTangents[m].z = pMesh->mTangents[m].z * -1.0;
        pMesh->mBitangents[m].z = pMesh->mBitangents[m].z * -1.0;
      }
    }
    for (a_1 = 0; a_1 < pMesh->mNumAnimMeshes; a_1 = a_1 + 1) {
      for (a_2 = 0; a_2 < pMesh->mAnimMeshes[a_1]->mNumVertices; a_2 = a_2 + 1) {
        paVar1 = pMesh->mAnimMeshes[a_1]->mVertices;
        paVar1[a_2].z = paVar1[a_2].z * -1.0;
        bVar3 = aiAnimMesh::HasNormals(pMesh->mAnimMeshes[a_1]);
        if (bVar3) {
          paVar1 = pMesh->mAnimMeshes[a_1]->mNormals;
          paVar1[a_2].z = paVar1[a_2].z * -1.0;
        }
        bVar3 = aiAnimMesh::HasTangentsAndBitangents(pMesh->mAnimMeshes[a_1]);
        if (bVar3) {
          paVar1 = pMesh->mAnimMeshes[a_1]->mTangents;
          paVar1[a_2].z = paVar1[a_2].z * -1.0;
          paVar1 = pMesh->mAnimMeshes[a_1]->mBitangents;
          paVar1[a_2].z = paVar1[a_2].z * -1.0;
        }
      }
    }
    for (bone = (aiBone *)0x0; bone < (aiBone *)(ulong)pMesh->mNumBones;
        bone = (aiBone *)((long)&(bone->mName).length + 1)) {
      paVar2 = pMesh->mBones[(long)bone];
      (paVar2->mOffsetMatrix).a3 = -(paVar2->mOffsetMatrix).a3;
      (paVar2->mOffsetMatrix).b3 = -(paVar2->mOffsetMatrix).b3;
      (paVar2->mOffsetMatrix).d3 = -(paVar2->mOffsetMatrix).d3;
      (paVar2->mOffsetMatrix).c1 = -(paVar2->mOffsetMatrix).c1;
      (paVar2->mOffsetMatrix).c2 = -(paVar2->mOffsetMatrix).c2;
      (paVar2->mOffsetMatrix).c4 = -(paVar2->mOffsetMatrix).c4;
    }
    bVar3 = aiMesh::HasTangentsAndBitangents(pMesh);
    if (bVar3) {
      for (local_44 = 0; local_44 < pMesh->mNumVertices; local_44 = local_44 + 1) {
        aiVector3t<float>::operator*=(pMesh->mBitangents + local_44,-1.0);
      }
    }
  }
  return;
}

Assistant:

void MakeLeftHandedProcess::ProcessMesh( aiMesh* pMesh) {
    if ( nullptr == pMesh ) {
        ASSIMP_LOG_ERROR( "Nullptr to mesh found." );
        return;
    }
    // mirror positions, normals and stuff along the Z axis
    for( size_t a = 0; a < pMesh->mNumVertices; ++a)
    {
        pMesh->mVertices[a].z *= -1.0f;
        if (pMesh->HasNormals()) {
            pMesh->mNormals[a].z *= -1.0f;
        }
        if( pMesh->HasTangentsAndBitangents())
        {
            pMesh->mTangents[a].z *= -1.0f;
            pMesh->mBitangents[a].z *= -1.0f;
        }
    }

    // mirror anim meshes positions, normals and stuff along the Z axis
    for (size_t m = 0; m < pMesh->mNumAnimMeshes; ++m)
    {
        for (size_t a = 0; a < pMesh->mAnimMeshes[m]->mNumVertices; ++a)
        {
            pMesh->mAnimMeshes[m]->mVertices[a].z *= -1.0f;
            if (pMesh->mAnimMeshes[m]->HasNormals()) {
                pMesh->mAnimMeshes[m]->mNormals[a].z *= -1.0f;
            }
            if (pMesh->mAnimMeshes[m]->HasTangentsAndBitangents())
            {
                pMesh->mAnimMeshes[m]->mTangents[a].z *= -1.0f;
                pMesh->mAnimMeshes[m]->mBitangents[a].z *= -1.0f;
            }
        }
    }

    // mirror offset matrices of all bones
    for( size_t a = 0; a < pMesh->mNumBones; ++a)
    {
        aiBone* bone = pMesh->mBones[a];
        bone->mOffsetMatrix.a3 = -bone->mOffsetMatrix.a3;
        bone->mOffsetMatrix.b3 = -bone->mOffsetMatrix.b3;
        bone->mOffsetMatrix.d3 = -bone->mOffsetMatrix.d3;
        bone->mOffsetMatrix.c1 = -bone->mOffsetMatrix.c1;
        bone->mOffsetMatrix.c2 = -bone->mOffsetMatrix.c2;
        bone->mOffsetMatrix.c4 = -bone->mOffsetMatrix.c4;
    }

    // mirror bitangents as well as they're derived from the texture coords
    if( pMesh->HasTangentsAndBitangents())
    {
        for( unsigned int a = 0; a < pMesh->mNumVertices; a++)
            pMesh->mBitangents[a] *= -1.0f;
    }
}